

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8d_vdpu1.c
# Opt level: O2

MPP_RET hal_vp8d_vdpu1_gen_regs(void *hal,HalTaskInfo *task)

{
  uint *puVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  RK_U32 RVar7;
  void *pvVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  long lVar11;
  undefined1 *puVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint *puVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  MppBuffer framebuf;
  uint *local_48;
  uint *local_40;
  MppBuffer local_38;
  
  framebuf = (MppBuffer)0x0;
  pvVar2 = *(void **)((long)hal + 0x18);
  pvVar3 = (task->dec).syntax.data;
  pvVar8 = pvVar2;
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0x1ca,
               "hal_vp8d_vdpu1_gen_regs");
    pvVar8 = *(void **)((long)hal + 0x18);
    if ((hal_vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0xa4,
                 "hal_vp8_init_hwcfg");
    }
  }
  memset(pvVar8,0,0x194);
  *(undefined4 *)((long)pvVar8 + 0xc) = 0xa0000000;
  *(undefined8 *)((long)pvVar8 + 4) = 0xf8071000000001;
  iVar5 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)((long)hal + 0x38),"hal_vp8_init_hwcfg");
  *(int *)((long)pvVar8 + 0x28) = iVar5;
  iVar5 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)((long)hal + 0x30),"hal_vp8_init_hwcfg");
  *(int *)((long)pvVar8 + 0xa0) = iVar5;
  if ((hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"leave\n",0xc4,
               "hal_vp8_init_hwcfg");
  }
  uVar6 = *(int *)((long)pvVar3 + 4) + 0xf;
  uVar18 = uVar6 >> 4;
  uVar26 = *(int *)((long)pvVar3 + 8) + 0xf;
  *(uint *)((long)pvVar2 + 0x10) =
       uVar26 >> 0xc & 7 |
       uVar6 >> 10 & 0x38 |
       (uVar26 & 0xff0) << 7 | *(uint *)((long)pvVar2 + 0x10) & 0x7807c0 | uVar18 << 0x17;
  if (((*(byte *)((long)pvVar3 + 0xd) & 1) == 0) &&
     (pvVar8 = mpp_buffer_get_ptr_with_caller
                         (*(MppBuffer *)((long)hal + 0x38),"hal_vp8d_vdpu1_gen_regs"),
     pvVar8 != (void *)0x0)) {
    memset(pvVar8,0,0xc00);
  }
  puVar9 = (undefined1 *)
           mpp_buffer_get_ptr_with_caller
                     (*(MppBuffer *)((long)hal + 0x30),"hal_vp8d_vdpu1_gen_regs");
  if (puVar9 != (undefined1 *)0x0) {
    if ((hal_vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0x163,
                 "hal_vp8hw_asic_probe_update");
    }
    *puVar9 = *(undefined1 *)((long)pvVar3 + 0x455);
    puVar9[1] = *(undefined1 *)((long)pvVar3 + 0x457);
    puVar9[2] = *(undefined1 *)((long)pvVar3 + 0x458);
    puVar9[3] = *(undefined1 *)((long)pvVar3 + 0x459);
    puVar9[4] = *(undefined1 *)((long)pvVar3 + 0x17);
    puVar9[5] = *(undefined1 *)((long)pvVar3 + 0x18);
    puVar9[6] = *(undefined1 *)((long)pvVar3 + 0x19);
    puVar9[7] = 0;
    puVar9[8] = *(undefined1 *)((long)pvVar3 + 0x45a);
    puVar9[9] = *(undefined1 *)((long)pvVar3 + 0x45b);
    puVar9[10] = *(undefined1 *)((long)pvVar3 + 0x45c);
    puVar9[0xb] = *(undefined1 *)((long)pvVar3 + 0x45d);
    puVar9[0xc] = *(undefined1 *)((long)pvVar3 + 0x45e);
    puVar9[0xd] = *(undefined1 *)((long)pvVar3 + 0x45f);
    puVar9[0xe] = *(undefined1 *)((long)pvVar3 + 0x460);
    puVar9[0xf] = 0;
    puVar9[0x10] = *(undefined1 *)((long)pvVar3 + 0x461);
    puVar9[0x11] = *(undefined1 *)((long)pvVar3 + 0x474);
    puVar9[0x12] = *(undefined1 *)((long)pvVar3 + 0x462);
    puVar9[0x13] = *(undefined1 *)((long)pvVar3 + 0x475);
    puVar9[0x14] = *(undefined1 *)((long)pvVar3 + 0x472);
    puVar9[0x15] = *(undefined1 *)((long)pvVar3 + 0x473);
    puVar9[0x16] = *(undefined1 *)((long)pvVar3 + 0x485);
    puVar9[0x17] = *(undefined1 *)((long)pvVar3 + 0x486);
    puVar10 = puVar9 + 0x18;
    lVar15 = (long)pvVar3 + 0x46d;
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      for (uVar19 = 0; uVar19 < 8; uVar19 = uVar19 + 4) {
        puVar10[uVar19] = *(undefined1 *)(lVar15 + -3 + uVar19);
        puVar10[uVar19 + 1] = *(undefined1 *)(lVar15 + -2 + uVar19);
        puVar10[uVar19 + 2] = *(undefined1 *)(lVar15 + -1 + uVar19);
        puVar10[uVar19 + 3] = *(undefined1 *)(lVar15 + uVar19);
      }
      lVar15 = lVar15 + 0x13;
      puVar10 = puVar10 + uVar19;
    }
    puVar12 = (undefined1 *)((long)pvVar3 + 0x469);
    for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
      puVar10[lVar15 * 8] = puVar12[-6];
      puVar10[lVar15 * 8 + 1] = puVar12[-5];
      puVar10[lVar15 * 8 + 2] = puVar12[-4];
      puVar10[lVar15 * 8 + 3] = puVar12[-3];
      puVar10[lVar15 * 8 + 4] = puVar12[-2];
      puVar10[lVar15 * 8 + 5] = puVar12[-1];
      puVar10[lVar15 * 8 + 6] = *puVar12;
      puVar10[lVar15 * 8 + 7] = 0;
      puVar12 = puVar12 + 0x13;
    }
    puVar10 = puVar9 + 0x38;
    lVar15 = (long)pvVar3 + 0x38;
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      lVar20 = lVar15;
      for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
        for (lVar24 = 0; lVar24 != 0x21; lVar24 = lVar24 + 0xb) {
          *puVar10 = *(undefined1 *)(lVar20 + -3 + lVar24);
          puVar10[1] = *(undefined1 *)(lVar20 + -2 + lVar24);
          puVar10[2] = *(undefined1 *)(lVar20 + -1 + lVar24);
          puVar10[3] = *(undefined1 *)(lVar20 + lVar24);
          puVar10 = puVar10 + 4;
        }
        lVar20 = lVar20 + 0x21;
      }
      lVar15 = lVar15 + 0x108;
    }
    puVar9 = puVar9 + 0x1b8;
    lVar15 = (long)pvVar3 + 0x3f;
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      lVar20 = lVar15;
      for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
        for (lVar24 = 0; lVar24 != 0x21; lVar24 = lVar24 + 0xb) {
          *puVar9 = *(undefined1 *)(lVar20 + -6 + lVar24);
          puVar9[1] = *(undefined1 *)(lVar20 + -5 + lVar24);
          puVar9[2] = *(undefined1 *)(lVar20 + -4 + lVar24);
          puVar9[3] = *(undefined1 *)(lVar20 + -3 + lVar24);
          puVar9[4] = *(undefined1 *)(lVar20 + -2 + lVar24);
          puVar9[5] = *(undefined1 *)(lVar20 + -1 + lVar24);
          puVar9[6] = *(undefined1 *)(lVar20 + lVar24);
          puVar9[7] = 0;
          puVar9 = puVar9 + 8;
        }
        lVar20 = lVar20 + 0x21;
      }
      lVar15 = lVar15 + 0x108;
    }
    if ((hal_vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"leave\n",0x1bb,
                 "hal_vp8hw_asic_probe_update");
    }
  }
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 8),*(byte *)((long)pvVar3 + 0xc) & 0x7f,SLOT_BUFFER,
             &framebuf);
  iVar5 = mpp_buffer_get_fd_with_caller(framebuf,"hal_vp8d_vdpu1_gen_regs");
  *(int *)((long)pvVar2 + 0x34) = iVar5;
  if ((*(byte *)((long)pvVar3 + 0xd) & 1) == 0) {
    uVar6 = uVar18 * (uVar26 >> 4) * 0x100;
    if (0x400000 < uVar6) {
      _mpp_log_l(4,"hal_vp8d_vdpu1","mb_width*mb_height is big then 0x400000,iommu err",(char *)0x0)
      ;
      iVar5 = *(int *)((long)pvVar2 + 0x34);
    }
    *(int *)((long)pvVar2 + 0x38) = iVar5;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0xe,uVar6);
  }
  else {
    uVar6 = *(byte *)((long)pvVar3 + 0x31) & 0x7f;
    if (uVar6 != 0x7f) {
      mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 8),uVar6,SLOT_BUFFER,&framebuf);
      iVar5 = mpp_buffer_get_fd_with_caller(framebuf,"hal_vp8d_vdpu1_gen_regs");
    }
    *(int *)((long)pvVar2 + 0x38) = iVar5;
  }
  uVar6 = *(byte *)((long)pvVar3 + 0x30) & 0x7f;
  if (uVar6 == 0x7f) {
    iVar5 = *(int *)((long)pvVar2 + 0x34);
  }
  else {
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 8),uVar6,SLOT_BUFFER,&framebuf);
    iVar5 = mpp_buffer_get_fd_with_caller(framebuf,"hal_vp8d_vdpu1_gen_regs");
  }
  *(int *)((long)pvVar2 + 0x48) = iVar5;
  if (*(byte *)((long)pvVar3 + 0x32) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x12,(uint)*(byte *)((long)pvVar3 + 0x32));
  }
  uVar6 = *(byte *)((long)pvVar3 + 0x2f) & 0x7f;
  if (uVar6 == 0x7f) {
    iVar5 = *(int *)((long)pvVar2 + 0x34);
  }
  else {
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 8),uVar6,SLOT_BUFFER,&framebuf);
    iVar5 = mpp_buffer_get_fd_with_caller(framebuf,"hal_vp8d_vdpu1_gen_regs");
  }
  *(int *)((long)pvVar2 + 0x4c) = iVar5;
  if (*(byte *)((long)pvVar3 + 0x33) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x13,(uint)*(byte *)((long)pvVar3 + 0x33));
  }
  if ((*(byte *)((long)pvVar3 + 0xe) & 3) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),10,*(byte *)((long)pvVar3 + 0xe) & 3);
  }
  uVar18 = (*(byte *)((long)pvVar3 + 0xd) & 1) << 0x14;
  uVar6 = *(uint *)((long)pvVar2 + 0xc);
  *(uint *)((long)pvVar2 + 0xc) = uVar6 & 0xffefffff | uVar18;
  uVar6 = uVar6 & 0xfbefffff | uVar18 | (uint)(*(char *)((long)pvVar3 + 0x456) == '\0') << 0x1a;
  *(uint *)((long)pvVar2 + 0xc) = uVar6;
  if ((*(byte *)((long)pvVar3 + 0xe) & 1) == 0) {
    *(uint *)((long)pvVar2 + 0x80) =
         *(uint *)((long)pvVar2 + 0x80) & 0xff03ffff |
         (*(byte *)((long)pvVar3 + 0x1b) & 0x3f) << 0x12;
  }
  else {
    if ((*(byte *)((long)pvVar3 + 0xe) & 4) == 0) {
      uVar18 = (int)*(char *)((long)pvVar3 + 0x13) + (uint)*(byte *)((long)pvVar3 + 0x1b);
      uVar26 = 0xfc0000;
      if (uVar18 < 0x40) {
        uVar26 = uVar18 * 0x40000;
      }
      if ((int)uVar18 < 0) {
        uVar26 = 0;
      }
      uVar13 = *(uint *)((long)pvVar2 + 0x80);
      *(uint *)((long)pvVar2 + 0x80) = uVar13 & 0xff03ffff | uVar26;
      uVar18 = (int)*(char *)((long)pvVar3 + 0x14) + (uint)*(byte *)((long)pvVar3 + 0x1b);
      uVar14 = 0x3f000;
      if (uVar18 < 0x40) {
        uVar14 = uVar18 * 0x1000;
      }
      if ((int)uVar18 < 0) {
        uVar14 = 0;
      }
      *(uint *)((long)pvVar2 + 0x80) = uVar13 & 0xff000fff | uVar26 | uVar14;
      uVar18 = (int)*(char *)((long)pvVar3 + 0x15) + (uint)*(byte *)((long)pvVar3 + 0x1b);
      uVar21 = 0xfc0;
      if (uVar18 < 0x40) {
        uVar21 = uVar18 * 0x40;
      }
      if ((int)uVar18 < 0) {
        uVar21 = 0;
      }
      *(uint *)((long)pvVar2 + 0x80) = uVar13 & 0xff00003f | uVar26 | uVar14 | uVar21;
      uVar23 = (int)*(char *)((long)pvVar3 + 0x16) + (uint)*(byte *)((long)pvVar3 + 0x1b);
      uVar18 = 0x3f;
      if ((int)uVar23 < 0x40) {
        uVar18 = uVar23 & 0x3f;
      }
      if ((int)uVar23 < 0) {
        uVar18 = 0;
      }
      uVar18 = uVar13 & 0xff000000 | uVar26 | uVar14 | uVar21 | uVar18;
    }
    else {
      uVar18 = *(uint *)((long)pvVar2 + 0x80);
      uVar26 = (*(byte *)((long)pvVar3 + 0x13) & 0x3f) << 0x12;
      *(uint *)((long)pvVar2 + 0x80) = uVar18 & 0xff03ffff | uVar26;
      uVar13 = (*(byte *)((long)pvVar3 + 0x14) & 0x3f) << 0xc;
      *(uint *)((long)pvVar2 + 0x80) = uVar18 & 0xff000fff | uVar26 | uVar13;
      uVar14 = (*(byte *)((long)pvVar3 + 0x15) & 0x3f) << 6;
      *(uint *)((long)pvVar2 + 0x80) = uVar18 & 0xff00003f | uVar26 | uVar13 | uVar14;
      uVar18 = uVar18 & 0xff000000 | uVar26 | uVar13 | uVar14 |
               *(byte *)((long)pvVar3 + 0x16) & 0x3f;
    }
    *(uint *)((long)pvVar2 + 0x80) = uVar18;
  }
  uVar26 = (uint)*(byte *)((long)pvVar3 + 0x1a) << 0x1f;
  uVar18 = *(uint *)((long)pvVar2 + 0x78);
  *(uint *)((long)pvVar2 + 0x78) = uVar18 & 0x7fffffff | uVar26;
  uVar13 = (*(byte *)((long)pvVar3 + 0x1c) & 7) << 0x1c;
  *(uint *)((long)pvVar2 + 0x78) = uVar18 & 0xfffffff | uVar26 | uVar13;
  if (*(char *)((long)pvVar3 + 0x1b) == '\0') {
    *(uint *)((long)pvVar2 + 0xc) = uVar6 | 0x4000;
  }
  if ((*(byte *)((long)pvVar3 + 0xd) & 0xe) != 6) {
    *(byte *)((long)pvVar2 + 0x1d) = *(byte *)((long)pvVar2 + 0x1d) | 0x20;
  }
  if ((*(int *)((long)pvVar3 + 0x488) == 2) && ((*(byte *)((long)pvVar3 + 0xd) & 6) != 0)) {
    *(byte *)((long)pvVar2 + 0x1d) = *(byte *)((long)pvVar2 + 0x1d) | 0x10;
  }
  uVar6 = *(uint *)((long)pvVar2 + 0x14) & 0xffff00ff |
          (*(uint *)((long)pvVar3 + 0x48c) & 0xff) << 8;
  *(uint *)((long)pvVar2 + 0x14) = uVar6;
  *(uint *)((long)pvVar2 + 0x14) =
       CONCAT31((int3)(uVar6 >> 8),*(undefined1 *)((long)pvVar3 + 0x490));
  if ((*(byte *)((long)pvVar3 + 0xe) & 1) == 0) {
    uVar14 = *(uint *)((long)pvVar2 + 0x84) & 0xffc007ff |
             ((int)*(char *)((long)pvVar3 + 0x2a) & 0x7ffU) << 0xb;
    *(uint *)((long)pvVar2 + 0x84) = uVar14;
    uVar6 = *(uint *)((long)pvVar2 + 0xb8);
  }
  else {
    if ((*(byte *)((long)pvVar3 + 0xe) & 4) == 0) {
      uVar6 = (int)*(char *)((long)pvVar3 + 0xf) + (int)*(char *)((long)pvVar3 + 0x2a);
      uVar21 = uVar6 * 0x800;
      if (0x7f < uVar6) {
        uVar21 = 0x3f800;
      }
      if ((int)uVar6 < 0) {
        uVar21 = 0;
      }
      uVar6 = *(uint *)((long)pvVar2 + 0x84);
      *(uint *)((long)pvVar2 + 0x84) = uVar6 & 0xffc007ff | uVar21;
      uVar23 = (int)*(char *)((long)pvVar3 + 0x10) + (int)*(char *)((long)pvVar3 + 0x2a);
      uVar14 = uVar23 & 0x7ff;
      if (0x7f < (int)uVar23) {
        uVar14 = 0x7f;
      }
      if ((int)uVar23 < 0) {
        uVar14 = 0;
      }
      uVar14 = uVar6 & 0xffc00000 | uVar21 | uVar14;
      *(uint *)((long)pvVar2 + 0x84) = uVar14;
      uVar6 = (int)*(char *)((long)pvVar3 + 0x11) + (int)*(char *)((long)pvVar3 + 0x2a);
      uVar21 = uVar6 * 0x800;
      if (0x7f < uVar6) {
        uVar21 = 0x3f800;
      }
      if ((int)uVar6 < 0) {
        uVar21 = 0;
      }
      uVar23 = *(uint *)((long)pvVar2 + 0xb8);
      *(uint *)((long)pvVar2 + 0xb8) = uVar23 & 0xffc007ff | uVar21;
      uVar25 = (int)*(char *)((long)pvVar3 + 0x12) + (int)*(char *)((long)pvVar3 + 0x2a);
      uVar6 = uVar25 & 0x7ff;
      if (0x7f < (int)uVar25) {
        uVar6 = 0x7f;
      }
      if ((int)uVar25 < 0) {
        uVar6 = 0;
      }
      uVar6 = uVar23 & 0xffc00000 | uVar21 | uVar6;
    }
    else {
      uVar14 = ((int)*(char *)((long)pvVar3 + 0xf) & 0x7ffU) << 0xb;
      uVar6 = *(uint *)((long)pvVar2 + 0x84);
      *(uint *)((long)pvVar2 + 0x84) = uVar6 & 0xffc007ff | uVar14;
      uVar14 = uVar6 & 0xffc00000 | uVar14 | (int)*(char *)((long)pvVar3 + 0x10) & 0x7ffU;
      *(uint *)((long)pvVar2 + 0x84) = uVar14;
      uVar6 = *(uint *)((long)pvVar2 + 0xb8);
      uVar21 = ((int)*(char *)((long)pvVar3 + 0x11) & 0x7ffU) << 0xb;
      *(uint *)((long)pvVar2 + 0xb8) = uVar6 & 0xffc007ff | uVar21;
      uVar6 = uVar6 & 0xffc00000 | uVar21 | (int)*(char *)((long)pvVar3 + 0x12) & 0x7ffU;
    }
    *(uint *)((long)pvVar2 + 0xb8) = uVar6;
  }
  uVar21 = (uint)*(byte *)((long)pvVar3 + 0x29) << 0x1b;
  *(uint *)((long)pvVar2 + 0x84) = uVar14 & 0x7ffffff | uVar21;
  *(uint *)((long)pvVar2 + 0x84) =
       uVar14 & 0x3fffff | uVar21 | (*(byte *)((long)pvVar3 + 0x2b) & 0x1f) << 0x16;
  uVar14 = *(int *)((long)pvVar3 + 0x2c) << 0x1b;
  *(uint *)((long)pvVar2 + 0xb8) = uVar6 & 0x7ffffff | uVar14;
  *(uint *)((long)pvVar2 + 0xb8) =
       uVar6 & 0x3fffff | uVar14 | (*(byte *)((long)pvVar3 + 0x2d) & 0x1f) << 0x16;
  *(uint *)((long)pvVar2 + 0xbc) =
       *(uint *)((long)pvVar2 + 0xbc) & 0x7ffffff | (uint)*(byte *)((long)pvVar3 + 0x2e) << 0x1b;
  if (*(char *)((long)pvVar3 + 0x1d) != '\0') {
    uVar14 = (*(byte *)((long)pvVar3 + 0x1f) & 0x7f) << 0x15;
    uVar6 = *(uint *)((long)pvVar2 + 0x7c);
    *(uint *)((long)pvVar2 + 0x7c) = uVar6 & 0xf01fffff | uVar14;
    uVar21 = (*(byte *)((long)pvVar3 + 0x20) & 0x7f) << 0xe;
    *(uint *)((long)pvVar2 + 0x7c) = uVar6 & 0xf0003fff | uVar14 | uVar21;
    uVar23 = (*(byte *)((long)pvVar3 + 0x21) & 0x7f) << 7;
    *(uint *)((long)pvVar2 + 0x7c) = uVar6 & 0xf000007f | uVar14 | uVar21 | uVar23;
    *(uint *)((long)pvVar2 + 0x7c) =
         uVar6 & 0xf0000000 | uVar14 | uVar21 | uVar23 | *(byte *)((long)pvVar3 + 0x22) & 0x7f;
    uVar21 = (*(byte *)((long)pvVar3 + 0x23) & 0x7f) << 0x15;
    *(uint *)((long)pvVar2 + 0x78) = uVar18 & 0x1fffff | uVar26 | uVar13 | uVar21;
    uVar6 = (*(byte *)((long)pvVar3 + 0x24) & 0x7f) << 0xe;
    *(uint *)((long)pvVar2 + 0x78) = uVar18 & 0x3fff | uVar26 | uVar13 | uVar21 | uVar6;
    uVar14 = (*(byte *)((long)pvVar3 + 0x25) & 0x7f) << 7;
    *(uint *)((long)pvVar2 + 0x78) = uVar18 & 0x7f | uVar26 | uVar13 | uVar21 | uVar6 | uVar14;
    *(uint *)((long)pvVar2 + 0x78) =
         uVar26 | uVar13 | uVar21 | uVar6 | uVar14 | *(byte *)((long)pvVar3 + 0x26) & 0x7f;
  }
  RVar7 = hal_vp8d_debug;
  if ((*(byte *)((long)pvVar3 + 0xd) & 6) == 0) {
    lVar15 = *(long *)((long)hal + 0x18);
    bVar27 = true;
    if ((hal_vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0xcc,
                 "hal_vp8d_pre_filter_tap_set");
      bVar27 = (hal_vp8d_debug & 1) == 0;
    }
    RVar7 = hal_vp8d_debug;
    *(uint *)(lVar15 + 0xc4) = *(uint *)(lVar15 + 0xc4) & 3 | 0x80000;
    *(uint *)(lVar15 + 0x88) = *(uint *)(lVar15 + 0x88) & 3 | 0x3fa1ec;
    *(uint *)(lVar15 + 0x8c) = *(uint *)(lVar15 + 0x8c) & 3 | 0x33fffd4;
    *(uint *)(lVar15 + 0x90) = *(uint *)(lVar15 + 0x90) & 3 | 0x1b024fe0;
    *(uint *)(lVar15 + 0x94) = *(uint *)(lVar15 + 0x94) & 3 | 0xfdc5d0c8;
    *(ulong *)(lVar15 + 0x98) = *(ulong *)(lVar15 + 0x98) & 0x300000003 | (ulong)DAT_00292a10;
    *(ulong *)(lVar15 + 0xa8) = *(ulong *)(lVar15 + 0xa8) & 0x300000003 | (ulong)DAT_00292a20;
    *(uint *)(lVar15 + 0xb0) = *(uint *)(lVar15 + 0xb0) & 3 | 0xfd7ff030;
    *(undefined4 *)(lVar15 + 0xb4) = 0x1effa9f6;
    if (!bVar27) {
      _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"leave\n",0xfa,
                 "hal_vp8d_pre_filter_tap_set");
      RVar7 = hal_vp8d_debug;
    }
  }
  local_38 = (MppBuffer)0x0;
  lVar15 = *(long *)((long)hal + 0x18);
  pvVar2 = (task->dec).syntax.data;
  if ((RVar7 & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0x10a,
               "hal_vp8d_dct_partition_cfg");
  }
  mpp_buf_slot_get_prop(*hal,(task->dec).input,SLOT_BUFFER,&local_38);
  iVar5 = mpp_buffer_get_fd_with_caller(local_38,"hal_vp8d_dct_partition_cfg");
  *(int *)(lVar15 + 0x6c) = iVar5;
  if (*(RK_U32 *)((long)pvVar2 + 0x494) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0x1b,*(RK_U32 *)((long)pvVar2 + 0x494));
  }
  *(uint *)(lVar15 + 0x14) =
       *(uint *)(lVar15 + 0x14) & 0xff03ffff | (*(uint *)((long)pvVar2 + 0x4bc) & 0x3f) << 0x12;
  uVar6 = 0;
  iVar17 = 0;
  if (*(int *)((long)pvVar2 + 0x488) == 2) {
    iVar17 = 7;
    if ((*(byte *)((long)pvVar2 + 0xd) & 1) != 0) {
      iVar17 = 0;
    }
  }
  *(uint *)(lVar15 + 0x18) =
       ((*(int *)((long)pvVar2 + 0x4c4) + *(int *)((long)pvVar2 + 0x4c0)) -
       *(int *)((long)pvVar2 + 0x498)) + (*(int *)((long)pvVar2 + 0x498) + iVar17 & 7U) +
       (3 << (*(byte *)((long)pvVar2 + 0x27) & 0x1f)) + 0xfffffd & 0xffffff |
       (uint)*(byte *)(lVar15 + 0x1b) << 0x18;
  local_40 = (uint *)(lVar15 + 0x14);
  uVar26 = (uint)*(byte *)(lVar15 + 0x27) << 0x18;
  uVar18 = ((*(int *)((long)pvVar2 + 0x4c8) + iVar17 + *(int *)((long)pvVar2 + 0x4c0)) -
           *(int *)((long)pvVar2 + 0x494)) + 1U & 0xffffff;
  *(uint *)(lVar15 + 0x24) = uVar18 | uVar26;
  *(uint *)(lVar15 + 0x24) =
       (0x1000000 << (*(byte *)((long)pvVar2 + 0x27) & 0x1f)) + 0xf000000U & 0xf000000 |
       uVar18 | uVar26 & 0xf0ffffff;
  puVar1 = (uint *)(lVar15 + 0x2c);
  local_48 = (uint *)(lVar15 + 0x1c);
  do {
    if (uVar6 >> (*(byte *)((long)pvVar2 + 0x27) & 0x1f) != 0) {
      if ((hal_vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"leave\n",0x15a,
                   "hal_vp8d_dct_partition_cfg");
      }
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x30),0,"hal_vp8d_vdpu1_gen_regs");
      mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x38),0,"hal_vp8d_vdpu1_gen_regs");
      if ((hal_vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"leave\n",0x26b,
                   "hal_vp8d_vdpu1_gen_regs");
      }
      return MPP_OK;
    }
    uVar18 = *(int *)((long)pvVar2 + (ulong)uVar6 * 4 + 0x498) + iVar17;
    uVar26 = uVar18 & 0xfffffff8;
    if (uVar6 == 0) {
      *(int *)(lVar15 + 0x30) = iVar5;
      if (uVar26 != 0) {
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),0xc,uVar26);
      }
      uVar18 = uVar18 * 0x20000000;
      uVar26 = 0x3ffffff;
      puVar16 = local_40;
LAB_001f6642:
      *puVar16 = uVar26 & *puVar16 | uVar18;
    }
    else {
      if (uVar6 < 6) {
        *(int *)(lVar15 + 0x58 + (ulong)(uVar6 - 1) * 4) = iVar5;
        iVar4 = 0x15;
      }
      else {
        *(int *)(lVar15 + 0x70 + (ulong)(uVar6 - 6) * 4) = iVar5;
        iVar4 = 0x16;
      }
      if (uVar26 != 0) {
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x10),iVar4 + uVar6,uVar26);
      }
      if (uVar6 - 1 < 7) {
        uVar26 = uVar18 & 7;
        puVar16 = puVar1;
        switch(uVar6) {
        case 1:
          uVar18 = uVar18 * 0x20000000;
          uVar26 = 0x3ffffff;
          puVar16 = local_48;
          break;
        case 2:
          uVar18 = uVar26 << 0x17;
          uVar26 = 0xfc0fffff;
          puVar16 = local_48;
          break;
        case 3:
          uVar18 = uVar26 << 0x1b;
          uVar26 = 0xc0ffffff;
          break;
        case 4:
          uVar18 = uVar26 << 0x15;
          uVar26 = 0xff03ffff;
          break;
        case 5:
          uVar18 = uVar26 << 0xf;
          uVar26 = 0xfffc0fff;
          break;
        case 6:
          uVar18 = uVar26 << 9;
          uVar26 = 0xfffff03f;
          break;
        case 7:
          uVar18 = uVar26 << 3;
          uVar26 = 0xffffffc0;
        }
        goto LAB_001f6642;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

MPP_RET hal_vp8d_vdpu1_gen_regs(void* hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    RK_U32 mb_width = 0, mb_height = 0;
    MppBuffer framebuf = NULL;
    RK_U8 *segmap_ptr = NULL;
    RK_U8 *probe_ptr = NULL;
    VP8DHalContext_t *ctx = (VP8DHalContext_t *)hal;
    VP8DRegSet_t *regs = (VP8DRegSet_t *)ctx->regs;
    DXVA_PicParams_VP8 *pic_param = (DXVA_PicParams_VP8 *)task->dec.syntax.data;

    FUN_T("enter\n");

    hal_vp8_init_hwcfg(ctx);
    mb_width = (pic_param->width + 15) >> 4;
    mb_height = (pic_param->height + 15) >> 4;

    regs->reg4.sw_pic_mb_width = mb_width & 0x1FF;
    regs->reg4.sw_pic_mb_hight_p =  mb_height & 0xFF;
    regs->reg4.sw_pic_mb_w_ext = mb_width >> 9;
    regs->reg4.sw_pic_mb_h_ext = mb_height >> 8;

    if (!pic_param->frame_type) {
        segmap_ptr = mpp_buffer_get_ptr(ctx->seg_map);
        if (NULL != segmap_ptr) {
            memset(segmap_ptr, 0, VP8D_MAX_SEGMAP_SIZE);
        }
    }

    probe_ptr = mpp_buffer_get_ptr(ctx->probe_table);
    if (NULL != probe_ptr) {
        hal_vp8hw_asic_probe_update(pic_param, probe_ptr);
    }
    mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->CurrPic.Index7Bits, SLOT_BUFFER, &framebuf);
    regs->reg13_cur_pic_base = mpp_buffer_get_fd(framebuf);
    if (!pic_param->frame_type) { //key frame
        if ((mb_width * mb_height) << 8 > 0x400000) {
            mpp_log("mb_width*mb_height is big then 0x400000,iommu err");
        }
        regs->reg14_ref0_base = regs->reg13_cur_pic_base;
        mpp_dev_set_reg_offset(ctx->dev, 14, (mb_width * mb_height) << 8);
    } else if (pic_param->lst_fb_idx.Index7Bits < 0x7f) { //config ref0 base
        mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->lst_fb_idx.Index7Bits, SLOT_BUFFER, &framebuf);
        regs->reg14_ref0_base = mpp_buffer_get_fd(framebuf);
    } else {
        regs->reg14_ref0_base = regs->reg13_cur_pic_base;
    }

    /* golden reference */
    if (pic_param->gld_fb_idx.Index7Bits < 0x7f) {
        mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->gld_fb_idx.Index7Bits, SLOT_BUFFER, &framebuf);
        regs->reg18_golden_ref_base = mpp_buffer_get_fd(framebuf);
    } else {
        regs->reg18_golden_ref_base = regs->reg13_cur_pic_base;
    }

    if (pic_param->ref_frame_sign_bias_golden) {
        mpp_dev_set_reg_offset(ctx->dev, 18, pic_param->ref_frame_sign_bias_golden);
    }

    /* alternate reference */
    if (pic_param->alt_fb_idx.Index7Bits < 0x7f) {
        mpp_buf_slot_get_prop(ctx->frame_slots, pic_param->alt_fb_idx.Index7Bits, SLOT_BUFFER, &framebuf);
        regs->reg19.alternate_ref_base = mpp_buffer_get_fd(framebuf);
    } else {
        regs->reg19.alternate_ref_base = regs->reg13_cur_pic_base;
    }

    if (pic_param->ref_frame_sign_bias_altref) {
        mpp_dev_set_reg_offset(ctx->dev, 19, pic_param->ref_frame_sign_bias_altref);
    }

    if (pic_param->stVP8Segments.segmentation_enabled || pic_param->stVP8Segments.update_mb_segmentation_map) {
        mpp_dev_set_reg_offset(ctx->dev, 10, (pic_param->stVP8Segments.segmentation_enabled
                                              + (pic_param->stVP8Segments.update_mb_segmentation_map << 1)));
    }

    regs->reg3.sw_pic_inter_e = pic_param->frame_type;
    regs->reg3.sw_skip_mode = !pic_param->mb_no_coeff_skip;

    if (!pic_param->stVP8Segments.segmentation_enabled) {
        regs->reg32.sw_filt_level_0 = pic_param->filter_level;
    } else if (pic_param->stVP8Segments.update_mb_segmentation_data) {
        regs->reg32.sw_filt_level_0 =
            pic_param->stVP8Segments.segment_feature_data[1][0];
        regs->reg32.sw_filt_level_1 =
            pic_param->stVP8Segments.segment_feature_data[1][1];
        regs->reg32.sw_filt_level_2 =
            pic_param->stVP8Segments.segment_feature_data[1][2];
        regs->reg32.sw_filt_level_3 =
            pic_param->stVP8Segments.segment_feature_data[1][3];
    } else {
        regs->reg32.sw_filt_level_0 = CLIP3(0, 63,
                                            (RK_S32)pic_param->filter_level
                                            + pic_param->stVP8Segments.segment_feature_data[1][0]);
        regs->reg32.sw_filt_level_1 = CLIP3(0, 63,
                                            (RK_S32)pic_param->filter_level
                                            + pic_param->stVP8Segments.segment_feature_data[1][1]);
        regs->reg32.sw_filt_level_2 = CLIP3(0, 63,
                                            (RK_S32)pic_param->filter_level
                                            + pic_param->stVP8Segments.segment_feature_data[1][2]);
        regs->reg32.sw_filt_level_3 = CLIP3(0, 63,
                                            (RK_S32)pic_param->filter_level
                                            + pic_param->stVP8Segments.segment_feature_data[1][3]);
    }

    regs->reg30.sw_filt_type = pic_param->filter_type;
    regs->reg30.sw_filt_sharpness = pic_param->sharpness;

    if (pic_param->filter_level == 0)
        regs->reg3.sw_filtering_dis = 1;

    if (pic_param->version != 3)
        regs->reg7.sw_ch_mv_res = 1;

    if (pic_param->decMode == VP8HWD_VP8 && (pic_param->version & 0x3))
        regs->reg7.sw_bilin_mc_e = 1;

    regs->reg5.sw_boolean_value = pic_param->bool_value;
    regs->reg5.sw_boolean_range = pic_param->bool_range;

    {
        if (!pic_param->stVP8Segments.segmentation_enabled)
            regs->reg33.sw_quant_0 = pic_param->y1ac_delta_q;
        else if (pic_param->stVP8Segments.update_mb_segmentation_data) { /* absolute mode */
            regs->reg33.sw_quant_0 =
                pic_param->stVP8Segments.segment_feature_data[0][0];
            regs->reg33.sw_quant_1 =
                pic_param->stVP8Segments.segment_feature_data[0][1];
            regs->reg46.sw_quant_2 = pic_param->stVP8Segments.segment_feature_data[0][2];
            regs->reg46.sw_quant_3 = pic_param->stVP8Segments.segment_feature_data[0][3];
        } else { /* delta mode */
            regs->reg33.sw_quant_0 = CLIP3(0, 127,
                                           pic_param->y1ac_delta_q
                                           + pic_param->stVP8Segments.segment_feature_data[0][0]);
            regs->reg33.sw_quant_1 = CLIP3(0, 127,
                                           pic_param->y1ac_delta_q
                                           + pic_param->stVP8Segments.segment_feature_data[0][1]);
            regs->reg46.sw_quant_2 = CLIP3(0, 127,
                                           pic_param->y1ac_delta_q
                                           + pic_param->stVP8Segments.segment_feature_data[0][2]);
            regs->reg46.sw_quant_3 = CLIP3(0, 127,
                                           pic_param->y1ac_delta_q
                                           + pic_param->stVP8Segments.segment_feature_data[0][3]);
        }

        regs->reg33.sw_quant_delta_0 = pic_param->y1dc_delta_q;
        regs->reg33.sw_quant_delta_1 = pic_param->y2dc_delta_q;
        regs->reg46.sw_quant_delta_2 = pic_param->y2ac_delta_q;
        regs->reg46.sw_quant_delta_3 = pic_param->uvdc_delta_q;
        regs->reg47.sw_quant_delta_4 = pic_param->uvac_delta_q;

        if (pic_param->mode_ref_lf_delta_enabled) {
            regs->reg31.sw_filt_ref_adj_0 = pic_param->ref_lf_deltas[0];
            regs->reg31.sw_filt_ref_adj_1 = pic_param->ref_lf_deltas[1];
            regs->reg31.sw_filt_ref_adj_2 = pic_param->ref_lf_deltas[2];
            regs->reg31.sw_filt_ref_adj_3 = pic_param->ref_lf_deltas[3];
            regs->reg30.sw_filt_mb_adj_0  = pic_param->mode_lf_deltas[0];
            regs->reg30.sw_filt_mb_adj_1  = pic_param->mode_lf_deltas[1];
            regs->reg30.sw_filt_mb_adj_2  = pic_param->mode_lf_deltas[2];
            regs->reg30.sw_filt_mb_adj_3  = pic_param->mode_lf_deltas[3];
        }
    }

    if ((pic_param->version & 0x3) == 0)
        hal_vp8d_pre_filter_tap_set(ctx);

    hal_vp8d_dct_partition_cfg(ctx, task);

    mpp_buffer_sync_end(ctx->probe_table);
    mpp_buffer_sync_end(ctx->seg_map);

    FUN_T("leave\n");
    return ret;
}